

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall IR::IRBuilder::jump(IRBuilder *this,BasicBlock *target)

{
  BasicBlock *this_00;
  bool bVar1;
  reference local_20;
  BasicBlock *local_18;
  BasicBlock *target_local;
  IRBuilder *this_local;
  
  local_18 = target;
  target_local = (BasicBlock *)this;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Jump,std::allocator<IR::Jump>>::emplace_front<IR::BasicBlock*&>
              ((forward_list<IR::Jump,std::allocator<IR::Jump>> *)&this->function_->jumps_,&local_18
              );
    this_00 = this->block_;
    local_20 = std::forward_list<IR::Jump,_std::allocator<IR::Jump>_>::front
                         (&this->function_->jumps_);
    std::vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>::push_back
              (&this_00->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>,
               (value_type *)&local_20);
  }
  return;
}

Assistant:

void IRBuilder::jump(BasicBlock* target) {
  if (block_->isTerminated()) return;
  function_->jumps_.emplace_front(target);
  block_->push_back(&function_->jumps_.front());
}